

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

qint64 __thiscall
QJsonValueConstRef::concreteInt
          (QJsonValueConstRef *this,QJsonValueConstRef self,qint64 defaultValue,bool clamp)

{
  QSharedData *pQVar1;
  double dVar2;
  int iVar3;
  QCborContainerPrivate *pQVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  
  dVar6 = self._8_8_;
  uVar7 = (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1);
  pQVar4 = (this->field_0).a[6].a.d.ptr;
  pQVar1 = &pQVar4->super_QSharedData + uVar7 * 4;
  iVar3 = (int)(&pQVar4->usedData)[uVar7 * 2];
  if (iVar3 == 0) {
    dVar5 = *(double *)pQVar1;
  }
  else {
    dVar5 = dVar6;
    if ((iVar3 == 0x202) &&
       (dVar2 = *(double *)pQVar1, dVar5 = (double)(long)dVar2, dVar2 != (double)(long)dVar5)) {
      dVar5 = dVar6;
    }
  }
  if ((double)(long)SUB84(dVar5,0) == dVar5) {
    dVar6 = dVar5;
  }
  if ((char)defaultValue == '\0') {
    dVar6 = dVar5;
  }
  return (qint64)dVar6;
}

Assistant:

qint64 QJsonValueConstRef::concreteInt(QJsonValueConstRef self, qint64 defaultValue, bool clamp) noexcept
{
    auto &e = QJsonPrivate::Value::elementHelper(self);
    qint64 v = defaultValue;
    if (e.type == QCborValue::Double) {
        // convertDoubleTo modifies the output even on returning false
        if (!convertDoubleTo<qint64>(e.fpvalue(), &v))
            v = defaultValue;
    } else if (e.type == QCborValue::Integer) {
        v = e.value;
    }
    if (clamp && qint64(int(v)) != v)
        return defaultValue;
    return v;
}